

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O1

void __thiscall QDialogButtonBox::changeEvent(QDialogButtonBox *this,QEvent *event)

{
  QDialogButtonBoxPrivate *this_00;
  long lVar1;
  void *pvVar2;
  QStyle *style;
  long lVar3;
  
  if (*(short *)(event + 8) == 100) {
    this_00 = *(QDialogButtonBoxPrivate **)(this + 8);
    if ((this_00->standardButtonMap).c.keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.s != 0)
    {
      style = QWidget::style((QWidget *)this);
      lVar1 = (this_00->standardButtonMap).c.keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.s
      ;
      if (lVar1 != 0) {
        pvVar2 = (this_00->standardButtonMap).c.keys.super_QVLABase<QPushButton_*>.
                 super_QVLABaseBase.ptr;
        lVar3 = 0;
        do {
          QWidget::setStyle(*(QWidget **)((long)pvVar2 + lVar3),style);
          lVar3 = lVar3 + 8;
        } while (lVar1 << 3 != lVar3);
      }
    }
    QDialogButtonBoxPrivate::initLayout(this_00);
    QDialogButtonBoxPrivate::layoutButtons(this_00);
  }
  QWidget::changeEvent((QWidget *)this,event);
  return;
}

Assistant:

void QDialogButtonBox::changeEvent(QEvent *event)
{
    Q_D(QDialogButtonBox);
    switch (event->type()) {
    case QEvent::StyleChange:  // Propagate style
        if (!d->standardButtonMap.empty()) {
            QStyle *newStyle = style();
            for (auto key : d->standardButtonMap.keys())
                key->setStyle(newStyle);
        }
#ifdef Q_OS_MAC
        Q_FALLTHROUGH();
    case QEvent::MacSizeChange:
#endif
        d->resetLayout();
        QWidget::changeEvent(event);
        break;
    default:
        QWidget::changeEvent(event);
        break;
    }
}